

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O1

void __thiscall DifferentialEquation::~DifferentialEquation(DifferentialEquation *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DifferentialEquation_0015c900;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__DifferentialEquation_0015c990;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__DifferentialEquation_0015c9d8;
  ppSVar1 = (this->eqnIntegrators).
            super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->eqnIntegrators).
                                  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  ppSVar2 = (this->eqnIntegrands).
            super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->eqnIntegrands).
                                  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar2
                   );
  }
  StochasticProcess::~StochasticProcess((StochasticProcess *)this);
  return;
}

Assistant:

DifferentialEquation::~DifferentialEquation()
{
}